

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O0

UBool __thiscall icu_63::Edits::growArray(Edits *this)

{
  uint16_t *__dest;
  uint16_t *newArray;
  int32_t newCapacity;
  Edits *this_local;
  
  if (this->array == this->stackArray) {
    newArray._4_4_ = 2000;
  }
  else {
    if (this->capacity == 0x7fffffff) {
      this->errorCode_ = U_INDEX_OUTOFBOUNDS_ERROR;
      return '\0';
    }
    if (this->capacity < 0x3fffffff) {
      newArray._4_4_ = this->capacity << 1;
    }
    else {
      newArray._4_4_ = 0x7fffffff;
    }
  }
  if (newArray._4_4_ - this->capacity < 5) {
    this->errorCode_ = U_INDEX_OUTOFBOUNDS_ERROR;
    this_local._7_1_ = '\0';
  }
  else {
    __dest = (uint16_t *)uprv_malloc_63((long)newArray._4_4_ << 1);
    if (__dest == (uint16_t *)0x0) {
      this->errorCode_ = U_MEMORY_ALLOCATION_ERROR;
      this_local._7_1_ = '\0';
    }
    else {
      memcpy(__dest,this->array,(long)this->length << 1);
      releaseArray(this);
      this->array = __dest;
      this->capacity = newArray._4_4_;
      this_local._7_1_ = '\x01';
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool Edits::growArray() {
    int32_t newCapacity;
    if (array == stackArray) {
        newCapacity = 2000;
    } else if (capacity == INT32_MAX) {
        // Not U_BUFFER_OVERFLOW_ERROR because that could be confused on a string transform API
        // with a result-string-buffer overflow.
        errorCode_ = U_INDEX_OUTOFBOUNDS_ERROR;
        return FALSE;
    } else if (capacity >= (INT32_MAX / 2)) {
        newCapacity = INT32_MAX;
    } else {
        newCapacity = 2 * capacity;
    }
    // Grow by at least 5 units so that a maximal change record will fit.
    if ((newCapacity - capacity) < 5) {
        errorCode_ = U_INDEX_OUTOFBOUNDS_ERROR;
        return FALSE;
    }
    uint16_t *newArray = (uint16_t *)uprv_malloc((size_t)newCapacity * 2);
    if (newArray == NULL) {
        errorCode_ = U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    uprv_memcpy(newArray, array, (size_t)length * 2);
    releaseArray();
    array = newArray;
    capacity = newCapacity;
    return TRUE;
}